

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

bool __thiscall flatbuffers::Parser::Deserialize(Parser *this,Schema *schema)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  bool bVar4;
  ushort uVar5;
  long lVar6;
  StructDef *pSVar7;
  StructDef *e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  const_iterator cVar9;
  Namespace *pNVar10;
  const_iterator cVar11;
  ServiceDef *this_00;
  _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
  *this_01;
  unsigned_short vtsize;
  Schema *pSVar12;
  ushort uVar13;
  Schema *pSVar14;
  size_t sVar15;
  ulong uVar16;
  uint8_t *offset_location;
  uint8_t *offset_location_10;
  EnumDef *this_02;
  uint8_t *offset_location_3;
  bool bVar17;
  string qualified_name;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  namespaces_index;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  SymbolTable<flatbuffers::Type> *local_98;
  SymbolTable<flatbuffers::ServiceDef> *local_90;
  key_type local_88;
  SymbolTable<flatbuffers::EnumDef> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  local_60;
  
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 9) ||
     (lVar6 = -(long)*(int *)schema, *(short *)(schema + lVar6 + 8) == 0)) {
    pSVar12 = (Schema *)0x15254d;
    pSVar14 = (Schema *)0x15254d;
  }
  else {
    if (*(ushort *)(schema + -(long)*(int *)schema) < 9) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + lVar6 + 8);
    }
    uVar16 = (ulong)uVar5;
    pSVar14 = schema + *(uint *)(schema + uVar16) + uVar16 + 4;
    pSVar12 = schema + (ulong)*(uint *)(schema + *(uint *)(schema + uVar16) + uVar16) +
                       *(uint *)(schema + uVar16) + uVar16 + 4;
  }
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,pSVar14,pSVar12);
  std::__cxx11::string::operator=((string *)&this->file_identifier_,(string *)local_d8);
  pSVar7 = (StructDef *)(local_d8 + 0x10);
  if ((StructDef *)local_d8._0_8_ != pSVar7) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  if ((*(ushort *)(schema + -(long)*(int *)schema) < 0xb) ||
     (lVar6 = -(long)*(int *)schema, *(short *)(schema + lVar6 + 10) == 0)) {
    pSVar12 = (Schema *)0x15254d;
    pSVar14 = (Schema *)0x15254d;
  }
  else {
    if (*(ushort *)(schema + -(long)*(int *)schema) < 0xb) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + lVar6 + 10);
    }
    uVar16 = (ulong)uVar5;
    pSVar14 = schema + *(uint *)(schema + uVar16) + uVar16 + 4;
    pSVar12 = schema + (ulong)*(uint *)(schema + *(uint *)(schema + uVar16) + uVar16) +
                       *(uint *)(schema + uVar16) + uVar16 + 4;
  }
  local_d8._0_8_ = pSVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,pSVar14,pSVar12);
  std::__cxx11::string::operator=((string *)&this->file_extension_,(string *)local_d8);
  if ((StructDef *)local_d8._0_8_ != pSVar7) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)((long)&local_60._M_impl + 8);
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar5 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (4 < *(ushort *)(schema + -(long)*(int *)schema)) {
    uVar5 = *(ushort *)(schema + (4 - (long)*(int *)schema));
  }
  if (uVar5 == 0) {
    pSVar12 = (Schema *)0x0;
  }
  else {
    pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
  }
  local_90 = (SymbolTable<flatbuffers::ServiceDef> *)&this->structs_;
  local_98 = &this->types_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + (4 - (long)*(int *)schema));
    }
    uVar16 = (ulong)uVar5;
    if (pSVar12 + 4 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
                 *(uint *)(schema + uVar16) + uVar16 + 4) {
      if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(schema + (6 - (long)*(int *)schema));
      }
      if (uVar5 == 0) {
        pSVar12 = (Schema *)0x0;
      }
      else {
        pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
      }
      goto LAB_00122c4f;
    }
    pSVar7 = (StructDef *)operator_new(0x148);
    StructDef::StructDef(pSVar7);
    uVar16 = (ulong)*(uint *)(pSVar12 + 4);
    lVar6 = uVar16 - (long)*(int *)(pSVar12 + uVar16 + 4);
    uVar5 = *(ushort *)(pSVar12 + lVar6 + 4);
    if (uVar5 < 0xd) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(ushort *)(pSVar12 + lVar6 + 0x10);
    }
    if (uVar13 == 0) {
      sVar15 = 0;
    }
    else {
      sVar15 = (size_t)*(int *)(pSVar12 + uVar13 + uVar16 + 4);
    }
    pSVar7->bytesize = sVar15;
    if (uVar5 < 9) {
      uVar13 = 0;
    }
    else {
      uVar13 = *(ushort *)(pSVar12 + lVar6 + 0xc);
    }
    if (uVar13 == 0) {
      bVar17 = false;
    }
    else {
      bVar17 = pSVar12[uVar13 + uVar16 + 4].super_Table != (Table)0x0;
    }
    pSVar7->fixed = bVar17;
    if (uVar5 < 0xb) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + lVar6 + 0xe);
    }
    if (uVar5 == 0) {
      sVar15 = 0;
    }
    else {
      sVar15 = (size_t)*(int *)(pSVar12 + uVar5 + uVar16 + 4);
    }
    pSVar7->minalign = sVar15;
    uVar16 = (ulong)*(uint *)(pSVar12 + 4);
    if (*(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16 + 4)) + 4) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16 + 4)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar12 + uVar5 + uVar16 + 4) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar12 + lVar6 + 8,
               pSVar12 + (ulong)*(uint *)(pSVar12 + lVar6 + 4) + lVar6 + 8);
    bVar17 = SymbolTable<flatbuffers::StructDef>::Add
                       ((SymbolTable<flatbuffers::StructDef> *)local_90,(string *)local_d8,pSVar7);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    if (bVar17) {
      StructDef::~StructDef(pSVar7);
      uVar16 = 0x148;
      goto LAB_00122e6b;
    }
    e = (StructDef *)operator_new(0x20);
    (e->super_Definition).name._M_dataplus._M_p = (pointer)0xf;
    (e->super_Definition).name._M_string_length = (size_type)pSVar7;
    (e->super_Definition).name.field_2._M_allocated_capacity = 0;
    *(undefined2 *)((long)&(e->super_Definition).name.field_2 + 8) = 0;
    uVar16 = (ulong)*(uint *)(pSVar12 + 4);
    if (*(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16 + 4)) + 4) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16 + 4)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar12 + uVar5 + uVar16 + 4) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar12 + lVar6 + 8,
               pSVar12 + (ulong)*(uint *)(pSVar12 + lVar6 + 4) + lVar6 + 8);
    bVar17 = SymbolTable<flatbuffers::Type>::Add(local_98,(string *)local_d8,(Type *)e);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar12 = pSVar12 + 4;
  } while (!bVar17);
  goto LAB_00122de3;
  while( true ) {
    if (*(ushort *)(schema + -(long)*(int *)schema) < 0xd) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + (0xc - (long)*(int *)schema));
    }
    if (uVar5 == 0) {
      pSVar12 = (Schema *)0x0;
    }
    else {
      pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
    }
    if (pSVar14 + *(uint *)pSVar14 == pSVar12) {
      this->root_struct_def_ = pSVar7;
    }
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar12 = pSVar14;
    if (!bVar17) break;
LAB_00122ed5:
    pSVar14 = pSVar12 + 4;
    if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + (4 - (long)*(int *)schema));
    }
    uVar16 = (ulong)uVar5;
    if (pSVar14 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
                 *(uint *)(schema + uVar16) + uVar16 + 4) {
      if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(schema + (6 - (long)*(int *)schema));
      }
      if (uVar5 == 0) {
        pSVar12 = (Schema *)0x0;
      }
      else {
        pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
      }
      bVar17 = false;
      goto LAB_0012309d;
    }
    uVar16 = (ulong)*(uint *)pSVar14;
    if (*(ushort *)(pSVar14 + (uVar16 - (long)*(int *)(pSVar14 + uVar16))) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar14 + uVar16)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar14 + uVar5 + uVar16) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar6 + 4,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar6) + lVar6 + 4);
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::StructDef_*>_>_>
                    *)local_90,(string *)local_d8);
    if ((_Rb_tree_header *)cVar9._M_node ==
        &(this->structs_).dict._M_t._M_impl.super__Rb_tree_header) {
      pSVar7 = (StructDef *)0x0;
    }
    else {
      pSVar7 = *(StructDef **)(cVar9._M_node + 2);
    }
    pNVar10 = anon_unknown_0::GetNamespace
                        ((string *)local_d8,
                         (vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                          *)local_98,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                          *)&local_60);
    (pSVar7->super_Definition).defined_namespace = pNVar10;
    bVar17 = StructDef::Deserialize(pSVar7,this,(Object *)(pSVar14 + *(uint *)pSVar14));
    if (!bVar17) {
      if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) goto LAB_0012305f;
      break;
    }
  }
  goto LAB_00122e70;
  while( true ) {
    uVar16 = (ulong)*(uint *)pSVar14;
    if (*(ushort *)(pSVar14 + (uVar16 - (long)*(int *)(pSVar14 + uVar16))) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar14 + uVar16)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar14 + uVar5 + uVar16) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar6 + 4,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar6) + lVar6 + 4);
    cVar11 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::EnumDef_*>_>_>
                     *)local_68,(string *)local_d8);
    if ((_Rb_tree_header *)cVar11._M_node == &(this->enums_).dict._M_t._M_impl.super__Rb_tree_header
       ) {
      this_02 = (EnumDef *)0x0;
    }
    else {
      this_02 = *(EnumDef **)(cVar11._M_node + 2);
    }
    pNVar10 = anon_unknown_0::GetNamespace
                        ((string *)local_d8,
                         (vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                          *)local_98,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                          *)&local_60);
    (this_02->super_Definition).defined_namespace = pNVar10;
    bVar4 = EnumDef::Deserialize(this_02,this,(Enum *)(pSVar14 + *(uint *)pSVar14));
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar12 = pSVar14;
    if (!bVar4) break;
LAB_0012309d:
    pSVar14 = pSVar12 + 4;
    if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + (6 - (long)*(int *)schema));
    }
    uVar16 = (ulong)uVar5;
    if (pSVar14 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
                 *(uint *)(schema + uVar16) + uVar16 + 4) {
      if ((*(ushort *)(schema + -(long)*(int *)schema) < 0xf) ||
         (lVar6 = -(long)*(int *)schema, *(short *)(schema + lVar6 + 0xe) == 0)) goto LAB_001233e5;
      if (*(ushort *)(schema + -(long)*(int *)schema) < 0xf) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(schema + lVar6 + 0xe);
      }
      if (uVar5 == 0) {
        pSVar12 = (Schema *)0x0;
      }
      else {
        pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
      }
      local_90 = &this->services_;
      goto LAB_0012320d;
    }
  }
  goto LAB_00122e72;
LAB_0012320d:
  pSVar14 = pSVar12 + 4;
  if (*(ushort *)(schema + -(long)*(int *)schema) < 0xf) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(schema + (0xe - (long)*(int *)schema));
  }
  uVar16 = (ulong)uVar5;
  if (pSVar14 ==
      schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
               *(uint *)(schema + uVar16) + uVar16 + 4) goto LAB_001233e5;
  uVar16 = (ulong)*(uint *)pSVar14;
  if (*(ushort *)(pSVar14 + (uVar16 - (long)*(int *)(pSVar14 + uVar16))) < 5) {
    uVar5 = 0;
  }
  else {
    uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar14 + uVar16)) + 8);
  }
  lVar6 = (ulong)*(uint *)(pSVar14 + uVar5 + uVar16) + uVar5 + uVar16;
  local_d8._0_8_ = local_d8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,pSVar14 + lVar6 + 4,
             pSVar14 + (ulong)*(uint *)(pSVar14 + lVar6) + lVar6 + 4);
  this_00 = (ServiceDef *)operator_new(0x110);
  memset(this_00,0,0x110);
  paVar8 = &(this_00->super_Definition).name.field_2;
  (this_00->super_Definition).name._M_dataplus._M_p = (pointer)paVar8;
  (this_00->super_Definition).name._M_string_length = 0;
  (this_00->super_Definition).name.field_2._M_local_buf[0] = '\0';
  paVar1 = &(this_00->super_Definition).file.field_2;
  (this_00->super_Definition).file._M_dataplus._M_p = (pointer)paVar1;
  (this_00->super_Definition).file._M_string_length = 0;
  (this_00->super_Definition).file.field_2._M_local_buf[0] = '\0';
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_Definition).doc_comment.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
  (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  *(_Base_ptr *)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x10) = p_Var2;
  *(_Rb_tree_header **)
   ((long)&(this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header
   + 0x18) = p_Var2;
  (this_00->super_Definition).defined_namespace = (Namespace *)0x0;
  (this_00->super_Definition).serialized_location = 0;
  (this_00->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->super_Definition).generated = false;
  (this_00->super_Definition).index = -1;
  (this_00->super_Definition).refcount = 1;
  (this_00->super_Definition).declaration_file = (string *)0x0;
  p_Var2 = &(this_00->calls).dict._M_t._M_impl.super__Rb_tree_header;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->calls).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this_00->calls).vec.
  super__Vector_base<flatbuffers::RPCCall_*,_std::allocator<flatbuffers::RPCCall_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pNVar10 = anon_unknown_0::GetNamespace
                      ((string *)local_d8,
                       (vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>
                        *)local_98,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                        *)&local_60);
  (this_00->super_Definition).defined_namespace = pNVar10;
  bVar17 = ServiceDef::Deserialize(this_00,this,(Service *)(pSVar14 + *(uint *)pSVar14));
  if ((!bVar17) ||
     (bVar17 = SymbolTable<flatbuffers::ServiceDef>::Add(local_90,(string *)local_d8,this_00),
     bVar17)) goto LAB_00123444;
  pSVar12 = pSVar14;
  if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
    operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
  }
  goto LAB_0012320d;
LAB_001233e5:
  lVar6 = -(long)*(int *)schema;
  uVar5 = *(ushort *)(schema + -(long)*(int *)schema);
  if (uVar5 < 0x11) {
    uVar13 = 0;
  }
  else {
    uVar13 = *(ushort *)(schema + lVar6 + 0x10);
  }
  if (uVar13 == 0) {
    uVar16 = 0;
  }
  else {
    uVar16 = (ulong)*(uint *)(schema + uVar13);
  }
  this->advanced_features_ = uVar16;
  bVar17 = true;
  if ((0x12 < uVar5) && (*(short *)(schema + lVar6 + 0x12) != 0)) {
    if (uVar5 < 0x13) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + lVar6 + 0x12);
    }
    if (uVar5 == 0) {
      pSVar12 = (Schema *)0x0;
    }
    else {
      pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
    }
    paVar8 = &local_88.field_2;
    while( true ) {
      if (*(ushort *)(schema + -(long)*(int *)schema) < 0x13) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(schema + (0x12 - (long)*(int *)schema));
      }
      pSVar12 = pSVar12 + 4;
      uVar16 = (ulong)uVar5;
      if (pSVar12 ==
          schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
                   *(uint *)(schema + uVar16) + uVar16 + 4) break;
      uVar16 = (ulong)*(uint *)pSVar12;
      if (*(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16))) < 7) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(pSVar12 + ((uVar16 + 6) - (long)*(int *)(pSVar12 + uVar16)));
      }
      if (uVar5 == 0) {
        pSVar14 = (Schema *)0x0;
      }
      else {
        pSVar14 = pSVar12 + (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + uVar5 + uVar16;
      }
      pSVar14 = pSVar14 + 8;
      while( true ) {
        uVar16 = (ulong)*(uint *)pSVar12;
        if (*(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16))) < 7) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(pSVar12 + ((uVar16 + 6) - (long)*(int *)(pSVar12 + uVar16)));
        }
        lVar6 = uVar5 + uVar16;
        if (pSVar14 + -4 ==
            pSVar12 + (ulong)(uint)(*(int *)(pSVar12 +
                                            (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + lVar6) << 2
                                   ) + (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + lVar6 + 4)
        break;
        local_d8._0_8_ = local_d8 + 0x10;
        local_d8._8_8_ = 0;
        local_d8[0x10] = '\0';
        local_b8._M_allocated_capacity = (size_type)&local_a8;
        local_b8._8_8_ = 0;
        local_a8._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,pSVar14 + *(uint *)(pSVar14 + -4),
                   pSVar14 + *(uint *)(pSVar14 + -4) +
                   *(uint *)(pSVar14 + ((ulong)*(uint *)(pSVar14 + -4) - 4)));
        std::__cxx11::string::operator=((string *)local_b8._M_local_buf,(string *)&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar8) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        uVar16 = (ulong)*(uint *)pSVar12;
        if (*(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar12 + uVar16))) < 5) {
          uVar5 = 0;
        }
        else {
          uVar5 = *(ushort *)(pSVar12 + ((uVar16 + 4) - (long)*(int *)(pSVar12 + uVar16)));
        }
        lVar6 = uVar5 + uVar16;
        local_88._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,
                   pSVar12 + (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + lVar6 + 4,
                   pSVar12 + (ulong)*(uint *)(pSVar12 +
                                             (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + lVar6) +
                             (ulong)*(uint *)(pSVar12 + uVar5 + uVar16) + lVar6 + 4);
        this_01 = (_Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<flatbuffers::IncludedFile,_std::less<flatbuffers::IncludedFile>,_std::allocator<flatbuffers::IncludedFile>_>_>_>_>
                     ::operator[](&this->files_included_per_file_,&local_88);
        std::
        _Rb_tree<flatbuffers::IncludedFile,flatbuffers::IncludedFile,std::_Identity<flatbuffers::IncludedFile>,std::less<flatbuffers::IncludedFile>,std::allocator<flatbuffers::IncludedFile>>
        ::_M_insert_unique<flatbuffers::IncludedFile_const&>(this_01,(IncludedFile *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != paVar8) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity != &local_a8) {
          operator_delete((void *)local_b8._M_allocated_capacity,
                          CONCAT71(local_a8._M_allocated_capacity._1_7_,local_a8._M_local_buf[0]) +
                          1);
        }
        if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
          operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
        }
        pSVar14 = pSVar14 + 4;
      }
    }
    bVar17 = true;
  }
  goto LAB_00122e72;
LAB_00123444:
  SymbolTable<flatbuffers::RPCCall>::~SymbolTable(&this_00->calls);
  SymbolTable<flatbuffers::Value>::~SymbolTable(&(this_00->super_Definition).attributes);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this_00->super_Definition).doc_comment);
  pcVar3 = (this_00->super_Definition).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this_00->super_Definition).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar8) {
    operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
  }
  operator_delete(this_00,0x110);
  if ((StructDef *)local_d8._0_8_ == (StructDef *)(local_d8 + 0x10)) goto LAB_00122e70;
LAB_0012305f:
  uVar16 = CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1;
  pSVar7 = (StructDef *)local_d8._0_8_;
  goto LAB_00122e6b;
  while( true ) {
    pSVar7 = (StructDef *)operator_new(0x138);
    EnumDef::EnumDef((EnumDef *)pSVar7);
    uVar16 = (ulong)*(uint *)pSVar14;
    if (*(ushort *)(pSVar14 + (uVar16 - (long)*(int *)(pSVar14 + uVar16))) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar14 + uVar16)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar14 + uVar5 + uVar16) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar6 + 4,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar6) + lVar6 + 4);
    bVar17 = SymbolTable<flatbuffers::EnumDef>::Add
                       (&this->enums_,(string *)local_d8,(EnumDef *)pSVar7);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    if (bVar17) {
      SymbolTable<flatbuffers::EnumVal>::~SymbolTable
                ((SymbolTable<flatbuffers::EnumVal> *)
                 &(pSVar7->fields).dict._M_t._M_impl.super__Rb_tree_header._M_node_count);
      SymbolTable<flatbuffers::Value>::~SymbolTable(&(pSVar7->super_Definition).attributes);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&(pSVar7->super_Definition).doc_comment);
      pcVar3 = (pSVar7->super_Definition).file._M_dataplus._M_p;
      paVar8 = &(pSVar7->super_Definition).file.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar8) {
        operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
      }
      pcVar3 = (pSVar7->super_Definition).name._M_dataplus._M_p;
      paVar8 = &(pSVar7->super_Definition).name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar3 != paVar8) {
        operator_delete(pcVar3,paVar8->_M_allocated_capacity + 1);
      }
      uVar16 = 0x138;
      goto LAB_00122e6b;
    }
    e = (StructDef *)operator_new(0x20);
    (e->super_Definition).name._M_dataplus._M_p = (pointer)0x10;
    (e->super_Definition).name._M_string_length = 0;
    *(StructDef **)&(e->super_Definition).name.field_2 = pSVar7;
    *(undefined2 *)((long)&(e->super_Definition).name.field_2 + 8) = 0;
    uVar16 = (ulong)*(uint *)pSVar14;
    if (*(ushort *)(pSVar14 + (uVar16 - (long)*(int *)(pSVar14 + uVar16))) < 5) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(pSVar12 + (uVar16 - (long)*(int *)(pSVar14 + uVar16)) + 8);
    }
    lVar6 = (ulong)*(uint *)(pSVar14 + uVar5 + uVar16) + uVar5 + uVar16;
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,pSVar14 + lVar6 + 4,
               pSVar14 + (ulong)*(uint *)(pSVar14 + lVar6) + lVar6 + 4);
    bVar17 = SymbolTable<flatbuffers::Type>::Add(local_98,(string *)local_d8,(Type *)e);
    if ((StructDef *)local_d8._0_8_ != (StructDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_,CONCAT71(local_d8._17_7_,local_d8[0x10]) + 1);
    }
    pSVar12 = pSVar14;
    if (bVar17) break;
LAB_00122c4f:
    pSVar14 = pSVar12 + 4;
    if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
      uVar5 = 0;
    }
    else {
      uVar5 = *(ushort *)(schema + (6 - (long)*(int *)schema));
    }
    uVar16 = (ulong)uVar5;
    if (pSVar14 ==
        schema + (ulong)(uint)(*(int *)(schema + *(uint *)(schema + uVar16) + uVar16) << 2) +
                 *(uint *)(schema + uVar16) + uVar16 + 4) {
      if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(schema + (4 - (long)*(int *)schema));
      }
      if (uVar5 == 0) {
        pSVar12 = (Schema *)0x0;
      }
      else {
        pSVar12 = schema + (ulong)*(uint *)(schema + uVar5) + (ulong)uVar5;
      }
      local_98 = (SymbolTable<flatbuffers::Type> *)&this->namespaces_;
      local_68 = &this->enums_;
      goto LAB_00122ed5;
    }
  }
LAB_00122de3:
  uVar16 = 0x20;
  pSVar7 = e;
LAB_00122e6b:
  operator_delete(pSVar7,uVar16);
LAB_00122e70:
  bVar17 = false;
LAB_00122e72:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  ::~_Rb_tree(&local_60);
  return bVar17;
}

Assistant:

bool Parser::Deserialize(const reflection::Schema *schema) {
  file_identifier_ = schema->file_ident() ? schema->file_ident()->str() : "";
  file_extension_ = schema->file_ext() ? schema->file_ext()->str() : "";
  std::map<std::string, Namespace *> namespaces_index;

  // Create defs without deserializing so references from fields to structs and
  // enums can be resolved.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    auto struct_def = new StructDef();
    struct_def->bytesize = it->bytesize();
    struct_def->fixed = it->is_struct();
    struct_def->minalign = it->minalign();
    if (structs_.Add(it->name()->str(), struct_def)) {
      delete struct_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_STRUCT, struct_def, nullptr);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    auto enum_def = new EnumDef();
    if (enums_.Add(it->name()->str(), enum_def)) {
      delete enum_def;
      return false;
    }
    auto type = new Type(BASE_TYPE_UNION, nullptr, enum_def);
    if (types_.Add(it->name()->str(), type)) {
      delete type;
      return false;
    }
  }

  // Now fields can refer to structs and enums by index.
  for (auto it = schema->objects()->begin(); it != schema->objects()->end();
       ++it) {
    std::string qualified_name = it->name()->str();
    auto struct_def = structs_.Lookup(qualified_name);
    struct_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!struct_def->Deserialize(*this, *it)) { return false; }
    if (schema->root_table() == *it) { root_struct_def_ = struct_def; }
  }
  for (auto it = schema->enums()->begin(); it != schema->enums()->end(); ++it) {
    std::string qualified_name = it->name()->str();
    auto enum_def = enums_.Lookup(qualified_name);
    enum_def->defined_namespace =
        GetNamespace(qualified_name, namespaces_, namespaces_index);
    if (!enum_def->Deserialize(*this, *it)) { return false; }
  }

  if (schema->services()) {
    for (auto it = schema->services()->begin(); it != schema->services()->end();
         ++it) {
      std::string qualified_name = it->name()->str();
      auto service_def = new ServiceDef();
      service_def->defined_namespace =
          GetNamespace(qualified_name, namespaces_, namespaces_index);
      if (!service_def->Deserialize(*this, *it) ||
          services_.Add(qualified_name, service_def)) {
        delete service_def;
        return false;
      }
    }
  }
  advanced_features_ = schema->advanced_features();

  if (schema->fbs_files())
    for (auto s = schema->fbs_files()->begin(); s != schema->fbs_files()->end();
         ++s) {
      for (auto f = s->included_filenames()->begin();
           f != s->included_filenames()->end(); ++f) {
        IncludedFile included_file;
        included_file.filename = f->str();
        files_included_per_file_[s->filename()->str()].insert(included_file);
      }
    }

  return true;
}